

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

self_ * __thiscall
standards::exp_number<double>::operator+=(exp_number<double> *this,exp_number<double> *rhs)

{
  double dVar1;
  double *pdVar2;
  double *in_RSI;
  self_ *in_RDI;
  self_ *psVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double extraout_XMM0_Qa_00;
  
  if (in_RDI->sign_ == 1) {
    if (*(int *)(in_RSI + 1) == 1) {
      psVar3 = in_RDI;
      pdVar2 = std::max<double>(&in_RDI->log_,in_RSI);
      dVar1 = *pdVar2;
      std::abs((int)psVar3);
      dVar4 = exp(-extraout_XMM0_Qa);
      dVar4 = log(dVar4 + 1.0);
      in_RDI->log_ = dVar1 + dVar4;
    }
    else if (*(int *)(in_RSI + 1) == -1) {
      if (in_RDI->log_ < *in_RSI || in_RDI->log_ == *in_RSI) {
        if (*in_RSI <= in_RDI->log_) {
          in_RDI->sign_ = 0;
        }
        else {
          dVar1 = *in_RSI;
          dVar4 = exp(in_RDI->log_ - *in_RSI);
          dVar4 = log(1.0 - dVar4);
          in_RDI->log_ = dVar1 + dVar4;
          in_RDI->sign_ = -1;
        }
      }
      else {
        dVar1 = in_RDI->log_;
        dVar4 = exp(*in_RSI - in_RDI->log_);
        dVar4 = log(1.0 - dVar4);
        in_RDI->log_ = dVar1 + dVar4;
      }
    }
  }
  else if (in_RDI->sign_ == -1) {
    if (*(int *)(in_RSI + 1) == 1) {
      if (in_RDI->log_ < *in_RSI || in_RDI->log_ == *in_RSI) {
        if (*in_RSI <= in_RDI->log_) {
          in_RDI->sign_ = 0;
        }
        else {
          dVar1 = *in_RSI;
          dVar4 = exp(in_RDI->log_ - *in_RSI);
          dVar4 = log(1.0 - dVar4);
          in_RDI->log_ = dVar1 + dVar4;
          in_RDI->sign_ = 1;
        }
      }
      else {
        dVar1 = in_RDI->log_;
        dVar4 = exp(*in_RSI - in_RDI->log_);
        dVar4 = log(1.0 - dVar4);
        in_RDI->log_ = dVar1 + dVar4;
      }
    }
    else if (*(int *)(in_RSI + 1) == -1) {
      psVar3 = in_RDI;
      pdVar2 = std::max<double>(&in_RDI->log_,in_RSI);
      dVar1 = *pdVar2;
      std::abs((int)psVar3);
      dVar4 = exp(-extraout_XMM0_Qa_00);
      dVar4 = log(dVar4 + 1.0);
      in_RDI->log_ = dVar1 + dVar4;
    }
  }
  else {
    in_RDI->log_ = *in_RSI;
    in_RDI->sign_ = *(int32_t *)(in_RSI + 1);
  }
  return in_RDI;
}

Assistant:

self_& operator+=(exp_number<U> const& rhs) {
    if (sign_ == is_positive) {
      if (rhs.sign_ == is_positive) {
        // pos + pos
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
      } else if (rhs.sign_ == is_negative) {
        if (log_ > rhs.log_) {
          // pos + neg = pos
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // pos + neg = neg
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_negative;
        } else {
          // pos + neg = zero
          sign_ = is_zero;
        }
      }
    } else if (sign_ == is_negative) {
      if (rhs.sign_ == is_positive) {
        if (log_ > rhs.log_) {
          // neg + pos = neg
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // neg + pos = pos
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_positive;
        } else {
          // neg + pos = zero
          sign_ = is_zero;
        }
      } else if (rhs.sign_ == is_negative)
        // neg + neg
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
    } else {
      log_ = rhs.log_;
      sign_ = rhs.sign_;
    }
    return *this;
  }